

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::Load<double>(Thread *this,Instr instr,double *out,Ptr *out_trap)

{
  pointer puVar1;
  Store *store;
  ulong uVar2;
  ulong uVar3;
  RunResult RVar4;
  Value VVar5;
  Ptr memory;
  Ptr local_68;
  string local_48;
  
  RefPtr<wabt::interp::Memory>::RefPtr
            (&memory,this->store_,
             (Ref)(this->inst_->memories_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  VVar5 = Pop(this);
  uVar2 = (ulong)instr.field_2.imm_u32x2.snd;
  uVar3 = (ulong)VVar5.i32_;
  puVar1 = ((memory.obj_)->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)((memory.obj_)->data_).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar1) < uVar3 + uVar2 + 8) {
    store = this->store_;
    StringPrintf_abi_cxx11_
              (&local_48,"out of bounds memory access: access at %lu+%zd >= max value %u",
               uVar3 + uVar2,8);
    Trap::New(&local_68,store,&local_48,&this->frames_);
    out_trap->obj_ = local_68.obj_;
    out_trap->store_ = local_68.store_;
    out_trap->root_index_ = local_68.root_index_;
    local_68.obj_ = (Trap *)0x0;
    local_68.store_ = (Store *)0x0;
    local_68.root_index_ = 0;
    RefPtr<wabt::interp::Trap>::reset(&local_68);
    std::__cxx11::string::_M_dispose();
    RVar4 = Trap;
  }
  else {
    *out = *(double *)(puVar1 + uVar2 + uVar3);
    RVar4 = Ok;
  }
  RefPtr<wabt::interp::Memory>::reset(&memory);
  return RVar4;
}

Assistant:

RunResult Thread::Load(Instr instr, T* out, Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2.fst]};
  u32 offset = Pop<u32>();
  TRAP_IF(Failed(memory->Load(offset, instr.imm_u32x2.snd, out)),
          StringPrintf("out of bounds memory access: access at %" PRIu64
                       "+%" PRIzd " >= max value %u",
                       u64{offset} + instr.imm_u32x2.snd, sizeof(T),
                       memory->ByteSize()));
  return RunResult::Ok;
}